

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void set_gop_bits_boost(AV1_COMP *cpi,int i,int is_intra_only,int is_final_pass,int use_alt_ref,
                       int alt_offset,FIRSTPASS_STATS *start_pos,GF_GROUP_STATS *gf_stats)

{
  int iVar1;
  int iVar2;
  int64_t *av_frame_err;
  int *inactive_zone;
  int64_t iVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  FIRSTPASS_STATS *in_stack_00000008;
  double *in_stack_00000010;
  int in_stack_00000020;
  int in_stack_00000024;
  FRAME_INFO *in_stack_00000028;
  PRIMARY_RATE_CONTROL *in_stack_00000030;
  int tmp_q;
  double group_av_inactive_zone;
  double group_av_skip_pct;
  double group_av_err;
  int in_stack_00000050;
  int vbr_group_bits_per_frame;
  int forward_frames;
  int ext_len;
  RateControlCfg *rc_cfg;
  AV1EncoderConfig *oxcf;
  FRAME_INFO *frame_info;
  GF_GROUP *gf_group;
  TWO_PASS *twopass;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  AV1_COMP *in_stack_ffffffffffffff70;
  int av_target_bandwidth;
  AV1_COMP *cpi_00;
  
  cpi_00 = (AV1_COMP *)(in_RDI + 0xc0ee);
  av_frame_err = (int64_t *)(*in_RDI + 0x8b30);
  inactive_zone = (int *)(*in_RDI + 0x5bc0);
  av_target_bandwidth = (int)((ulong)(*in_RDI + 400) >> 0x20);
  iVar1 = in_ESI - in_EDX;
  if (in_R8D == 0) {
    reset_fpf_position((TWO_PASS_FRAME *)(in_RDI + 0x13ac3),in_stack_00000008);
    uVar4 = *(undefined4 *)(*in_RDI + 0x5a88);
    iVar2 = av1_calc_arf_boost((TWO_PASS *)group_av_skip_pct,
                               (TWO_PASS_FRAME *)group_av_inactive_zone,in_stack_00000030,
                               in_stack_00000028,in_stack_00000024,in_stack_00000020,
                               in_stack_00000050,_forward_frames,(int *)rc_cfg,(int)oxcf);
    if (iVar2 < 0x1519) {
      uVar4 = *(undefined4 *)(*in_RDI + 0x5a88);
      in_stack_ffffffffffffff60 =
           av1_calc_arf_boost((TWO_PASS *)group_av_skip_pct,(TWO_PASS_FRAME *)group_av_inactive_zone
                              ,in_stack_00000030,in_stack_00000028,in_stack_00000024,
                              in_stack_00000020,in_stack_00000050,_forward_frames,(int *)rc_cfg,
                              (int)oxcf);
    }
    else {
      in_stack_ffffffffffffff60 = 0x1518;
    }
    *(int *)((long)av_frame_err + 0xc) = in_stack_ffffffffffffff60;
  }
  else {
    in_stack_ffffffffffffff68 = iVar1;
    if (*(int *)((long)in_RDI + 0x6079c) - in_ESI < iVar1) {
      if (*(int *)((long)in_RDI + 0x6079c) - in_ESI < 0) {
        in_stack_ffffffffffffff64 = 0;
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff64;
      }
      else {
        in_stack_ffffffffffffff64 = *(int *)((long)in_RDI + 0x6079c) - in_ESI;
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff64;
      }
    }
    uVar4 = *(undefined4 *)(*in_RDI + 0x5a88);
    iVar2 = av1_calc_arf_boost((TWO_PASS *)group_av_skip_pct,
                               (TWO_PASS_FRAME *)group_av_inactive_zone,in_stack_00000030,
                               in_stack_00000028,in_stack_00000024,in_stack_00000020,
                               in_stack_00000050,_forward_frames,(int *)rc_cfg,(int)oxcf);
    *(int *)((long)av_frame_err + 0xc) = iVar2;
  }
  *(undefined4 *)((long)av_frame_err + 0x215c) = 0x3f800000;
  if (((in_R8D != 0) &&
      (iVar2 = is_lossless_requested((RateControlCfg *)(in_RDI + 0x8472)), iVar2 == 0)) &&
     ((*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[1] + 6) - iVar1 == 1 ||
      (*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[1] + 6) == iVar1)))) {
    *(undefined4 *)((long)av_frame_err + 0x215c) = 0x3e4ccccd;
  }
  reset_fpf_position((TWO_PASS_FRAME *)(in_RDI + 0x13ac3),in_stack_00000008);
  if (*(int *)(*in_RDI + 0x5a88) != 0) {
    *in_stack_00000010 = (double)(int)av_frame_err[0x426];
  }
  iVar3 = calculate_total_gf_group_bits
                    (in_stack_ffffffffffffff70,
                     (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  *av_frame_err = iVar3;
  if (((*(int *)((long)in_RDI + 0x423dc) != 3) && (1 < (int)av_frame_err[0x426])) && (in_ECX != 0))
  {
    in_stack_ffffffffffffff70 =
         (AV1_COMP *)
         ((in_stack_00000010[3] * 2.0) /
         ((double)(int)av_frame_err[0x426] * (double)(int)in_RDI[0x7831]));
    in_stack_ffffffffffffff6c =
         get_twopass_worst_quality
                   (cpi_00,(double)av_frame_err,(double)inactive_zone,av_target_bandwidth);
    in_stack_ffffffffffffff5c = in_stack_ffffffffffffff6c;
    if (in_stack_ffffffffffffff6c <=
        *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0xc] + 2) >> 1) {
      in_stack_ffffffffffffff5c =
           *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0xc] + 2) >> 1;
    }
    *(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0xc] + 2) = in_stack_ffffffffffffff5c
    ;
  }
  if (in_ECX != 0) {
    *(double *)(inactive_zone + 0xbd0) = *(double *)(inactive_zone + 0xbd0) - *in_stack_00000010;
  }
  reset_fpf_position((TWO_PASS_FRAME *)(in_RDI + 0x13ac3),in_stack_00000008);
  if (*(int *)(cpi_00->enc_quant_dequant_params).quants.y_quant[2] != 0) {
    iVar1 = calculate_section_intra_ratio
                      (in_stack_00000008,*(FIRSTPASS_STATS **)(*(long *)(inactive_zone + 0x66) + 8),
                       (int)av_frame_err[0x426]);
    *inactive_zone = iVar1;
  }
  av1_gop_bit_allocation
            (in_stack_ffffffffffffff70,
             (RATE_CONTROL *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (GF_GROUP *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
             CONCAT44(in_stack_ffffffffffffff54,uVar4));
  if (in_ECX != 0) {
    *(int *)(*in_RDI + 0x5a84) = in_R8D;
    inactive_zone[0xbd4] = 1;
    inactive_zone[0xbd5] = 1;
  }
  return;
}

Assistant:

static void set_gop_bits_boost(AV1_COMP *cpi, int i, int is_intra_only,
                               int is_final_pass, int use_alt_ref,
                               int alt_offset, const FIRSTPASS_STATS *start_pos,
                               GF_GROUP_STATS *gf_stats) {
  // Should we use the alternate reference frame.
  AV1_COMMON *const cm = &cpi->common;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  GF_GROUP *gf_group = &cpi->ppi->gf_group;
  FRAME_INFO *frame_info = &cpi->frame_info;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  int ext_len = i - is_intra_only;
  if (use_alt_ref) {
    const int forward_frames = (rc->frames_to_key - i >= ext_len)
                                   ? ext_len
                                   : AOMMAX(0, rc->frames_to_key - i);

    // Calculate the boost for alt ref.
    p_rc->gfu_boost = av1_calc_arf_boost(
        twopass, &cpi->twopass_frame, p_rc, frame_info, alt_offset,
        forward_frames, ext_len, &p_rc->num_stats_used_for_gfu_boost,
        &p_rc->num_stats_required_for_gfu_boost, cpi->ppi->lap_enabled);
  } else {
    reset_fpf_position(&cpi->twopass_frame, start_pos);
    p_rc->gfu_boost = AOMMIN(
        MAX_GF_BOOST,
        av1_calc_arf_boost(
            twopass, &cpi->twopass_frame, p_rc, frame_info, alt_offset, ext_len,
            0, &p_rc->num_stats_used_for_gfu_boost,
            &p_rc->num_stats_required_for_gfu_boost, cpi->ppi->lap_enabled));
  }

#define LAST_ALR_BOOST_FACTOR 0.2f
  p_rc->arf_boost_factor = 1.0;
  if (use_alt_ref && !is_lossless_requested(rc_cfg)) {
    // Reduce the boost of altref in the last gf group
    if (rc->frames_to_key - ext_len == REDUCE_GF_LENGTH_BY ||
        rc->frames_to_key - ext_len == 0) {
      p_rc->arf_boost_factor = LAST_ALR_BOOST_FACTOR;
    }
  }

  // Reset the file position.
  reset_fpf_position(&cpi->twopass_frame, start_pos);
  if (cpi->ppi->lap_enabled) {
    // Since we don't have enough stats to know the actual error of the
    // gf group, we assume error of each frame to be equal to 1 and set
    // the error of the group as baseline_gf_interval.
    gf_stats->gf_group_err = p_rc->baseline_gf_interval;
  }
  // Calculate the bits to be allocated to the gf/arf group as a whole
  p_rc->gf_group_bits =
      calculate_total_gf_group_bits(cpi, gf_stats->gf_group_err);

#if GROUP_ADAPTIVE_MAXQ
  // Calculate an estimate of the maxq needed for the group.
  // We are more aggressive about correcting for sections
  // where there could be significant overshoot than for easier
  // sections where we do not wish to risk creating an overshoot
  // of the allocated bit budget.
  if ((rc_cfg->mode != AOM_Q) && (p_rc->baseline_gf_interval > 1) &&
      is_final_pass) {
    const int vbr_group_bits_per_frame =
        (int)(p_rc->gf_group_bits / p_rc->baseline_gf_interval);
    const double group_av_err =
        gf_stats->gf_group_raw_error / p_rc->baseline_gf_interval;
    const double group_av_skip_pct =
        gf_stats->gf_group_skip_pct / p_rc->baseline_gf_interval;
    const double group_av_inactive_zone =
        ((gf_stats->gf_group_inactive_zone_rows * 2) /
         (p_rc->baseline_gf_interval * (double)cm->mi_params.mb_rows));

    int tmp_q;
    tmp_q = get_twopass_worst_quality(
        cpi, group_av_err, (group_av_skip_pct + group_av_inactive_zone),
        vbr_group_bits_per_frame);
    rc->active_worst_quality = AOMMAX(tmp_q, rc->active_worst_quality >> 1);
  }
#endif

  // Adjust KF group bits and error remaining.
  if (is_final_pass) twopass->kf_group_error_left -= gf_stats->gf_group_err;

  // Reset the file position.
  reset_fpf_position(&cpi->twopass_frame, start_pos);

  // Calculate a section intra ratio used in setting max loop filter.
  if (rc->frames_since_key != 0) {
    twopass->section_intra_rating = calculate_section_intra_ratio(
        start_pos, twopass->stats_buf_ctx->stats_in_end,
        p_rc->baseline_gf_interval);
  }

  av1_gop_bit_allocation(cpi, rc, gf_group, rc->frames_since_key == 0,
                         use_alt_ref, p_rc->gf_group_bits);

  // TODO(jingning): Generalize this condition.
  if (is_final_pass) {
    cpi->ppi->gf_state.arf_gf_boost_lst = use_alt_ref;

    // Reset rolling actual and target bits counters for ARF groups.
    twopass->rolling_arf_group_target_bits = 1;
    twopass->rolling_arf_group_actual_bits = 1;
  }
#if CONFIG_BITRATE_ACCURACY
  if (is_final_pass) {
    av1_vbr_rc_set_gop_bit_budget(&cpi->vbr_rc_info,
                                  p_rc->baseline_gf_interval);
  }
#endif
}